

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf_avx2.c
# Opt level: O2

void uavs3d_alf_one_lcu_one_chroma_avx2
               (pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef,
               int sample_bit_depth)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  int iVar39;
  uint uVar40;
  uint uVar41;
  long lVar42;
  undefined1 (*pauVar43) [32];
  undefined1 (*pauVar44) [32];
  undefined1 (*pauVar45) [32];
  undefined1 (*pauVar46) [32];
  uint uVar47;
  undefined1 (*pauVar48) [32];
  undefined1 (*pauVar49) [32];
  ushort uVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  
  uVar50 = ~(ushort)(-1 << ((byte)sample_bit_depth & 0x1f));
  uVar5 = (undefined2)*coef;
  uVar6 = (undefined2)coef[2];
  uVar7 = (undefined2)coef[4];
  uVar8 = (undefined2)coef[6];
  uVar9 = (undefined2)coef[8];
  uVar10 = (undefined2)coef[10];
  uVar11 = (undefined2)coef[0xc];
  uVar12 = (undefined2)coef[0xe];
  iVar13 = coef[0x10];
  iVar39 = lcu_height + -4;
  uVar40 = lcu_height - 1;
  uVar47 = 0;
  uVar41 = lcu_height - 2;
  if (lcu_height < 1) {
    lcu_height = 0;
  }
  auVar56._8_2_ = 0xff;
  auVar56._0_8_ = 0xff00ff00ff00ff;
  auVar56._10_2_ = 0xff;
  auVar56._12_2_ = 0xff;
  auVar56._14_2_ = 0xff;
  auVar56._16_2_ = 0xff;
  auVar56._18_2_ = 0xff;
  auVar56._20_2_ = 0xff;
  auVar56._22_2_ = 0xff;
  auVar56._24_2_ = 0xff;
  auVar56._26_2_ = 0xff;
  auVar56._28_2_ = 0xff;
  auVar56._30_2_ = 0xff;
  for (; uVar47 != lcu_height; uVar47 = uVar47 + 1) {
    pauVar1 = (undefined1 (*) [32])(*(undefined1 (*) [32])src + i_src);
    pauVar2 = (undefined1 (*) [32])((long)src - (long)i_src);
    pauVar3 = (undefined1 (*) [32])(*(undefined1 (*) [32])src + i_src * 2);
    pauVar4 = (undefined1 (*) [32])((long)src - (long)(i_src * 2));
    pauVar48 = (undefined1 (*) [32])(*(undefined1 (*) [32])src + i_src * 3);
    pauVar43 = pauVar2;
    pauVar45 = pauVar3;
    pauVar46 = pauVar4;
    pauVar49 = pauVar1;
    if (uVar47 < 3) {
      pauVar43 = (undefined1 (*) [32])src;
      pauVar44 = (undefined1 (*) [32])src;
      pauVar46 = (undefined1 (*) [32])src;
      if ((uVar47 != 0) && (pauVar43 = pauVar2, pauVar44 = pauVar4, pauVar46 = pauVar4, uVar47 == 1)
         ) {
        pauVar44 = pauVar2;
        pauVar46 = pauVar2;
      }
    }
    else {
      pauVar44 = (undefined1 (*) [32])((long)src - (long)(i_src * 3));
      if (((iVar39 < (int)uVar47) &&
          (pauVar45 = (undefined1 (*) [32])src, pauVar48 = (undefined1 (*) [32])src,
          pauVar49 = (undefined1 (*) [32])src, uVar47 != uVar40)) &&
         (pauVar45 = pauVar3, pauVar48 = pauVar3, pauVar49 = pauVar1, uVar47 == uVar41)) {
        pauVar45 = pauVar1;
        pauVar48 = pauVar1;
      }
    }
    if (lcu_width < 0x11) {
      auVar51 = vpand_avx2(auVar56,*pauVar44);
      auVar55 = vpand_avx2(auVar56,*pauVar48);
      auVar51 = vpaddw_avx2(auVar55,auVar51);
      auVar55 = vpand_avx2(auVar56,*pauVar46);
      auVar20._2_2_ = uVar5;
      auVar20._0_2_ = uVar5;
      auVar20._4_2_ = uVar5;
      auVar20._6_2_ = uVar5;
      auVar20._8_2_ = uVar5;
      auVar20._10_2_ = uVar5;
      auVar20._12_2_ = uVar5;
      auVar20._14_2_ = uVar5;
      auVar20._16_2_ = uVar5;
      auVar20._18_2_ = uVar5;
      auVar20._20_2_ = uVar5;
      auVar20._22_2_ = uVar5;
      auVar20._24_2_ = uVar5;
      auVar20._26_2_ = uVar5;
      auVar20._28_2_ = uVar5;
      auVar20._30_2_ = uVar5;
      auVar20 = vpmullw_avx2(auVar51,auVar20);
      auVar51 = vpand_avx2(auVar56,*pauVar45);
      auVar51 = vpaddw_avx2(auVar51,auVar55);
      auVar55 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar43[-1] + 0x1e));
      auVar52 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar49 + 2));
      auVar24._2_2_ = uVar6;
      auVar24._0_2_ = uVar6;
      auVar24._4_2_ = uVar6;
      auVar24._6_2_ = uVar6;
      auVar24._8_2_ = uVar6;
      auVar24._10_2_ = uVar6;
      auVar24._12_2_ = uVar6;
      auVar24._14_2_ = uVar6;
      auVar24._16_2_ = uVar6;
      auVar24._18_2_ = uVar6;
      auVar24._20_2_ = uVar6;
      auVar24._22_2_ = uVar6;
      auVar24._24_2_ = uVar6;
      auVar24._26_2_ = uVar6;
      auVar24._28_2_ = uVar6;
      auVar24._30_2_ = uVar6;
      auVar21 = vpmullw_avx2(auVar51,auVar24);
      auVar51 = vpaddw_avx2(auVar52,auVar55);
      auVar55 = vpand_avx2(auVar56,*pauVar43);
      auVar52 = vpand_avx2(auVar56,*pauVar49);
      auVar54 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar43 + 2));
      auVar55 = vpaddw_avx2(auVar52,auVar55);
      auVar52 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar49[-1] + 0x1e));
      auVar52 = vpaddw_avx2(auVar52,auVar54);
      auVar37._2_2_ = uVar7;
      auVar37._0_2_ = uVar7;
      auVar37._4_2_ = uVar7;
      auVar37._6_2_ = uVar7;
      auVar37._8_2_ = uVar7;
      auVar37._10_2_ = uVar7;
      auVar37._12_2_ = uVar7;
      auVar37._14_2_ = uVar7;
      auVar37._16_2_ = uVar7;
      auVar37._18_2_ = uVar7;
      auVar37._20_2_ = uVar7;
      auVar37._22_2_ = uVar7;
      auVar37._24_2_ = uVar7;
      auVar37._26_2_ = uVar7;
      auVar37._28_2_ = uVar7;
      auVar37._30_2_ = uVar7;
      auVar22 = vpmullw_avx2(auVar51,auVar37);
      auVar35._2_2_ = uVar8;
      auVar35._0_2_ = uVar8;
      auVar35._4_2_ = uVar8;
      auVar35._6_2_ = uVar8;
      auVar35._8_2_ = uVar8;
      auVar35._10_2_ = uVar8;
      auVar35._12_2_ = uVar8;
      auVar35._14_2_ = uVar8;
      auVar35._16_2_ = uVar8;
      auVar35._18_2_ = uVar8;
      auVar35._20_2_ = uVar8;
      auVar35._22_2_ = uVar8;
      auVar35._24_2_ = uVar8;
      auVar35._26_2_ = uVar8;
      auVar35._28_2_ = uVar8;
      auVar35._30_2_ = uVar8;
      auVar23 = vpmullw_avx2(auVar55,auVar35);
      auVar54 = vpand_avx2(auVar56,*(undefined1 (*) [32])src);
      auVar51 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)src + -0x20) + 0x1a));
      auVar55 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + 6));
      auVar31._2_2_ = uVar9;
      auVar31._0_2_ = uVar9;
      auVar31._4_2_ = uVar9;
      auVar31._6_2_ = uVar9;
      auVar31._8_2_ = uVar9;
      auVar31._10_2_ = uVar9;
      auVar31._12_2_ = uVar9;
      auVar31._14_2_ = uVar9;
      auVar31._16_2_ = uVar9;
      auVar31._18_2_ = uVar9;
      auVar31._20_2_ = uVar9;
      auVar31._22_2_ = uVar9;
      auVar31._24_2_ = uVar9;
      auVar31._26_2_ = uVar9;
      auVar31._28_2_ = uVar9;
      auVar31._30_2_ = uVar9;
      auVar24 = vpmullw_avx2(auVar52,auVar31);
      auVar51 = vpaddw_avx2(auVar55,auVar51);
      auVar55 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)src + -0x20) + 0x1c));
      auVar52 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + 4));
      auVar14 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)src + -0x20) + 0x1e));
      auVar55 = vpaddw_avx2(auVar52,auVar55);
      auVar52 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + 2));
      auVar52 = vpaddw_avx2(auVar52,auVar14);
      auVar28._2_2_ = uVar10;
      auVar28._0_2_ = uVar10;
      auVar28._4_2_ = uVar10;
      auVar28._6_2_ = uVar10;
      auVar28._8_2_ = uVar10;
      auVar28._10_2_ = uVar10;
      auVar28._12_2_ = uVar10;
      auVar28._14_2_ = uVar10;
      auVar28._16_2_ = uVar10;
      auVar28._18_2_ = uVar10;
      auVar28._20_2_ = uVar10;
      auVar28._22_2_ = uVar10;
      auVar28._24_2_ = uVar10;
      auVar28._26_2_ = uVar10;
      auVar28._28_2_ = uVar10;
      auVar28._30_2_ = uVar10;
      auVar25 = vpmullw_avx2(auVar51,auVar28);
      auVar26._2_2_ = uVar11;
      auVar26._0_2_ = uVar11;
      auVar26._4_2_ = uVar11;
      auVar26._6_2_ = uVar11;
      auVar26._8_2_ = uVar11;
      auVar26._10_2_ = uVar11;
      auVar26._12_2_ = uVar11;
      auVar26._14_2_ = uVar11;
      auVar26._16_2_ = uVar11;
      auVar26._18_2_ = uVar11;
      auVar26._20_2_ = uVar11;
      auVar26._22_2_ = uVar11;
      auVar26._24_2_ = uVar11;
      auVar26._26_2_ = uVar11;
      auVar26._28_2_ = uVar11;
      auVar26._30_2_ = uVar11;
      auVar26 = vpmullw_avx2(auVar55,auVar26);
      auVar17._2_2_ = uVar12;
      auVar17._0_2_ = uVar12;
      auVar17._4_2_ = uVar12;
      auVar17._6_2_ = uVar12;
      auVar17._8_2_ = uVar12;
      auVar17._10_2_ = uVar12;
      auVar17._12_2_ = uVar12;
      auVar17._14_2_ = uVar12;
      auVar17._16_2_ = uVar12;
      auVar17._18_2_ = uVar12;
      auVar17._20_2_ = uVar12;
      auVar17._22_2_ = uVar12;
      auVar17._24_2_ = uVar12;
      auVar17._26_2_ = uVar12;
      auVar17._28_2_ = uVar12;
      auVar17._30_2_ = uVar12;
      auVar27 = vpmullw_avx2(auVar52,auVar17);
      auVar51 = vpmovzxwd_avx2(auVar54._0_16_);
      auVar15._4_4_ = iVar13;
      auVar15._0_4_ = iVar13;
      auVar15._8_4_ = iVar13;
      auVar15._12_4_ = iVar13;
      auVar15._16_4_ = iVar13;
      auVar15._20_4_ = iVar13;
      auVar15._24_4_ = iVar13;
      auVar15._28_4_ = iVar13;
      auVar52 = vpmullw_avx2(auVar51,auVar15);
      auVar51 = vpmovsxwd_avx2(auVar20._0_16_);
      auVar55 = vpmovsxwd_avx2(auVar21._0_16_);
      auVar51 = vpaddd_avx2(auVar51,auVar55);
      auVar55 = vpmovsxwd_avx2(auVar22._0_16_);
      auVar55 = vpaddd_avx2(auVar55,auVar52);
      auVar52 = vpmovsxwd_avx2(auVar23._0_16_);
      auVar14 = vpmovsxwd_avx2(auVar24._0_16_);
      auVar52 = vpaddd_avx2(auVar14,auVar52);
      auVar51 = vpaddd_avx2(auVar51,auVar52);
      auVar52 = vpmovsxwd_avx2(auVar25._0_16_);
      auVar14 = vpmovsxwd_avx2(auVar26._0_16_);
      auVar52 = vpaddd_avx2(auVar14,auVar52);
      auVar14 = vpmovsxwd_avx2(auVar27._0_16_);
      auVar55 = vpaddd_avx2(auVar55,auVar14);
      auVar51 = vpaddd_avx2(auVar51,auVar55);
      auVar55 = vpmovsxwd_avx2(auVar20._16_16_);
      auVar14 = vpmovsxwd_avx2(auVar21._16_16_);
      auVar55 = vpaddd_avx2(auVar55,auVar14);
      auVar54 = vpmovzxwd_avx2(auVar54._16_16_);
      auVar14 = vpmullw_avx2(auVar15,auVar54);
      auVar54 = vpmovsxwd_avx2(auVar22._16_16_);
      auVar54 = vpaddd_avx2(auVar54,auVar14);
      auVar14 = vpmovsxwd_avx2(auVar23._16_16_);
      auVar20 = vpmovsxwd_avx2(auVar24._16_16_);
      auVar14 = vpaddd_avx2(auVar20,auVar14);
      auVar55 = vpaddd_avx2(auVar55,auVar14);
      auVar14 = vpmovsxwd_avx2(auVar25._16_16_);
      auVar20 = vpmovsxwd_avx2(auVar26._16_16_);
      auVar14 = vpaddd_avx2(auVar20,auVar14);
      auVar20 = vpmovsxwd_avx2(auVar27._16_16_);
      auVar54 = vpaddd_avx2(auVar54,auVar20);
      auVar55 = vpaddd_avx2(auVar55,auVar54);
      auVar29._8_4_ = 0x20;
      auVar29._0_8_ = 0x2000000020;
      auVar29._12_4_ = 0x20;
      auVar29._16_4_ = 0x20;
      auVar29._20_4_ = 0x20;
      auVar29._24_4_ = 0x20;
      auVar29._28_4_ = 0x20;
      auVar52 = vpaddd_avx2(auVar52,auVar29);
      auVar51 = vpaddd_avx2(auVar51,auVar52);
      auVar52 = vpaddd_avx2(auVar14,auVar29);
      auVar55 = vpaddd_avx2(auVar55,auVar52);
      auVar52 = vpsrad_avx2(auVar51,6);
      auVar51 = vpsrad_avx2(auVar55,6);
      auVar51 = vpackssdw_avx2(auVar52,auVar51);
      auVar51 = vpermq_avx2(auVar51,0xd8);
      auVar30._2_2_ = uVar50;
      auVar30._0_2_ = uVar50;
      auVar30._4_2_ = uVar50;
      auVar30._6_2_ = uVar50;
      auVar30._8_2_ = uVar50;
      auVar30._10_2_ = uVar50;
      auVar30._12_2_ = uVar50;
      auVar30._14_2_ = uVar50;
      auVar30._16_2_ = uVar50;
      auVar30._18_2_ = uVar50;
      auVar30._20_2_ = uVar50;
      auVar30._22_2_ = uVar50;
      auVar30._24_2_ = uVar50;
      auVar30._26_2_ = uVar50;
      auVar30._28_2_ = uVar50;
      auVar30._30_2_ = uVar50;
      auVar51 = vpminsw_avx2(auVar51,auVar30);
      auVar51 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar51);
      auVar53._8_2_ = 0xff00;
      auVar53._0_8_ = 0xff00ff00ff00ff00;
      auVar53._10_2_ = 0xff00;
      auVar53._12_2_ = 0xff00;
      auVar53._14_2_ = 0xff00;
      auVar53._16_2_ = 0xff00;
      auVar53._18_2_ = 0xff00;
      auVar53._20_2_ = 0xff00;
      auVar53._22_2_ = 0xff00;
      auVar53._24_2_ = 0xff00;
      auVar53._26_2_ = 0xff00;
      auVar53._28_2_ = 0xff00;
      auVar53._30_2_ = 0xff00;
      auVar51 = vpblendvb_avx2(auVar51,*(undefined1 (*) [32])dst,auVar53);
      *(undefined1 (*) [32])dst = auVar51;
    }
    else {
      for (lVar42 = 0; lVar42 < lcu_width * 2; lVar42 = lVar42 + 0x40) {
        auVar51 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar44 + lVar42));
        auVar55 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar48 + lVar42));
        auVar52 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar44[1] + lVar42));
        auVar51 = vpaddw_avx2(auVar55,auVar51);
        auVar55 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar48[1] + lVar42));
        auVar55 = vpaddw_avx2(auVar55,auVar52);
        auVar52 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar46 + lVar42));
        auVar54 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar45 + lVar42));
        auVar14 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar46[1] + lVar42));
        auVar20 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar45[1] + lVar42));
        auVar52 = vpaddw_avx2(auVar54,auVar52);
        auVar54 = vpaddw_avx2(auVar20,auVar14);
        auVar14 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar43[-1] + lVar42 + 0x1e));
        auVar20 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar49 + lVar42 + 2));
        auVar21 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar43 + lVar42 + 0x1e));
        auVar14 = vpaddw_avx2(auVar20,auVar14);
        auVar20 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar49[1] + lVar42 + 2));
        auVar20 = vpaddw_avx2(auVar20,auVar21);
        auVar21 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar43 + lVar42));
        auVar22 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar49 + lVar42));
        auVar23 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar43[1] + lVar42));
        auVar24 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar49[1] + lVar42));
        auVar21 = vpaddw_avx2(auVar22,auVar21);
        auVar22 = vpaddw_avx2(auVar24,auVar23);
        auVar23 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar43 + lVar42 + 2));
        auVar24 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar49[-1] + lVar42 + 0x1e));
        auVar25 = vpand_avx2(auVar56,*(undefined1 (*) [32])(pauVar43[1] + lVar42 + 2));
        auVar23 = vpaddw_avx2(auVar24,auVar23);
        auVar24 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*pauVar49 + lVar42 + 0x1e));
        auVar24 = vpaddw_avx2(auVar24,auVar25);
        auVar25 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])((long)src + -0x20) + lVar42 + 0x1a));
        auVar26 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + lVar42 + 6))
        ;
        auVar27 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])src + lVar42 + 0x1a));
        auVar15 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])((long)src + 0x20) + lVar42 + 6));
        auVar25 = vpaddw_avx2(auVar26,auVar25);
        auVar26 = vpaddw_avx2(auVar15,auVar27);
        auVar27 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])((long)src + -0x20) + lVar42 + 0x1c));
        auVar15 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + lVar42 + 4))
        ;
        auVar16 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])src + lVar42 + 0x1c));
        auVar27 = vpaddw_avx2(auVar15,auVar27);
        auVar15 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])((long)src + 0x20) + lVar42 + 4));
        auVar15 = vpaddw_avx2(auVar15,auVar16);
        auVar16 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])((long)src + -0x20) + lVar42 + 0x1e));
        auVar17 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + lVar42 + 2))
        ;
        auVar18 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])src + lVar42 + 0x1e));
        auVar19 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])((long)src + 0x20) + lVar42 + 2));
        auVar16 = vpaddw_avx2(auVar17,auVar16);
        auVar17 = vpaddw_avx2(auVar19,auVar18);
        auVar18._2_2_ = uVar5;
        auVar18._0_2_ = uVar5;
        auVar18._4_2_ = uVar5;
        auVar18._6_2_ = uVar5;
        auVar18._8_2_ = uVar5;
        auVar18._10_2_ = uVar5;
        auVar18._12_2_ = uVar5;
        auVar18._14_2_ = uVar5;
        auVar18._16_2_ = uVar5;
        auVar18._18_2_ = uVar5;
        auVar18._20_2_ = uVar5;
        auVar18._22_2_ = uVar5;
        auVar18._24_2_ = uVar5;
        auVar18._26_2_ = uVar5;
        auVar18._28_2_ = uVar5;
        auVar18._30_2_ = uVar5;
        auVar19 = vpmullw_avx2(auVar51,auVar18);
        auVar51._2_2_ = uVar6;
        auVar51._0_2_ = uVar6;
        auVar51._4_2_ = uVar6;
        auVar51._6_2_ = uVar6;
        auVar51._8_2_ = uVar6;
        auVar51._10_2_ = uVar6;
        auVar51._12_2_ = uVar6;
        auVar51._14_2_ = uVar6;
        auVar51._16_2_ = uVar6;
        auVar51._18_2_ = uVar6;
        auVar51._20_2_ = uVar6;
        auVar51._22_2_ = uVar6;
        auVar51._24_2_ = uVar6;
        auVar51._26_2_ = uVar6;
        auVar51._28_2_ = uVar6;
        auVar51._30_2_ = uVar6;
        auVar28 = vpmullw_avx2(auVar52,auVar51);
        auVar51 = vpmovsxwd_avx2(auVar19._0_16_);
        auVar52 = vpmovsxwd_avx2(auVar28._0_16_);
        auVar51 = vpaddd_avx2(auVar52,auVar51);
        auVar38._2_2_ = uVar7;
        auVar38._0_2_ = uVar7;
        auVar38._4_2_ = uVar7;
        auVar38._6_2_ = uVar7;
        auVar38._8_2_ = uVar7;
        auVar38._10_2_ = uVar7;
        auVar38._12_2_ = uVar7;
        auVar38._14_2_ = uVar7;
        auVar38._16_2_ = uVar7;
        auVar38._18_2_ = uVar7;
        auVar38._20_2_ = uVar7;
        auVar38._22_2_ = uVar7;
        auVar38._24_2_ = uVar7;
        auVar38._26_2_ = uVar7;
        auVar38._28_2_ = uVar7;
        auVar38._30_2_ = uVar7;
        auVar29 = vpmullw_avx2(auVar14,auVar38);
        auVar18 = vpand_avx2(auVar56,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + lVar42));
        auVar52 = vpmovzxwd_avx2(auVar18._0_16_);
        auVar14._4_4_ = iVar13;
        auVar14._0_4_ = iVar13;
        auVar14._8_4_ = iVar13;
        auVar14._12_4_ = iVar13;
        auVar14._16_4_ = iVar13;
        auVar14._20_4_ = iVar13;
        auVar14._24_4_ = iVar13;
        auVar14._28_4_ = iVar13;
        auVar14 = vpmullw_avx2(auVar52,auVar14);
        auVar52 = vpmovsxwd_avx2(auVar29._0_16_);
        auVar52 = vpaddd_avx2(auVar52,auVar14);
        auVar36._2_2_ = uVar8;
        auVar36._0_2_ = uVar8;
        auVar36._4_2_ = uVar8;
        auVar36._6_2_ = uVar8;
        auVar36._8_2_ = uVar8;
        auVar36._10_2_ = uVar8;
        auVar36._12_2_ = uVar8;
        auVar36._14_2_ = uVar8;
        auVar36._16_2_ = uVar8;
        auVar36._18_2_ = uVar8;
        auVar36._20_2_ = uVar8;
        auVar36._22_2_ = uVar8;
        auVar36._24_2_ = uVar8;
        auVar36._26_2_ = uVar8;
        auVar36._28_2_ = uVar8;
        auVar36._30_2_ = uVar8;
        auVar30 = vpmullw_avx2(auVar21,auVar36);
        auVar34._2_2_ = uVar9;
        auVar34._0_2_ = uVar9;
        auVar34._4_2_ = uVar9;
        auVar34._6_2_ = uVar9;
        auVar34._8_2_ = uVar9;
        auVar34._10_2_ = uVar9;
        auVar34._12_2_ = uVar9;
        auVar34._14_2_ = uVar9;
        auVar34._16_2_ = uVar9;
        auVar34._18_2_ = uVar9;
        auVar34._20_2_ = uVar9;
        auVar34._22_2_ = uVar9;
        auVar34._24_2_ = uVar9;
        auVar34._26_2_ = uVar9;
        auVar34._28_2_ = uVar9;
        auVar34._30_2_ = uVar9;
        auVar31 = vpmullw_avx2(auVar34,auVar23);
        auVar14 = vpmovsxwd_avx2(auVar30._0_16_);
        auVar21 = vpmovsxwd_avx2(auVar31._0_16_);
        auVar14 = vpaddd_avx2(auVar21,auVar14);
        auVar51 = vpaddd_avx2(auVar51,auVar14);
        auVar32._2_2_ = uVar10;
        auVar32._0_2_ = uVar10;
        auVar32._4_2_ = uVar10;
        auVar32._6_2_ = uVar10;
        auVar32._8_2_ = uVar10;
        auVar32._10_2_ = uVar10;
        auVar32._12_2_ = uVar10;
        auVar32._14_2_ = uVar10;
        auVar32._16_2_ = uVar10;
        auVar32._18_2_ = uVar10;
        auVar32._20_2_ = uVar10;
        auVar32._22_2_ = uVar10;
        auVar32._24_2_ = uVar10;
        auVar32._26_2_ = uVar10;
        auVar32._28_2_ = uVar10;
        auVar32._30_2_ = uVar10;
        auVar32 = vpmullw_avx2(auVar25,auVar32);
        auVar25._2_2_ = uVar11;
        auVar25._0_2_ = uVar11;
        auVar25._4_2_ = uVar11;
        auVar25._6_2_ = uVar11;
        auVar25._8_2_ = uVar11;
        auVar25._10_2_ = uVar11;
        auVar25._12_2_ = uVar11;
        auVar25._14_2_ = uVar11;
        auVar25._16_2_ = uVar11;
        auVar25._18_2_ = uVar11;
        auVar25._20_2_ = uVar11;
        auVar25._22_2_ = uVar11;
        auVar25._24_2_ = uVar11;
        auVar25._26_2_ = uVar11;
        auVar25._28_2_ = uVar11;
        auVar25._30_2_ = uVar11;
        auVar27 = vpmullw_avx2(auVar27,auVar25);
        auVar14 = vpmovsxwd_avx2(auVar32._0_16_);
        auVar21 = vpmovsxwd_avx2(auVar27._0_16_);
        auVar14 = vpaddd_avx2(auVar21,auVar14);
        auVar21._2_2_ = uVar12;
        auVar21._0_2_ = uVar12;
        auVar21._4_2_ = uVar12;
        auVar21._6_2_ = uVar12;
        auVar21._8_2_ = uVar12;
        auVar21._10_2_ = uVar12;
        auVar21._12_2_ = uVar12;
        auVar21._14_2_ = uVar12;
        auVar21._16_2_ = uVar12;
        auVar21._18_2_ = uVar12;
        auVar21._20_2_ = uVar12;
        auVar21._22_2_ = uVar12;
        auVar21._24_2_ = uVar12;
        auVar21._26_2_ = uVar12;
        auVar21._28_2_ = uVar12;
        auVar21._30_2_ = uVar12;
        auVar16 = vpmullw_avx2(auVar16,auVar21);
        auVar21 = vpmovsxwd_avx2(auVar16._0_16_);
        auVar52 = vpaddd_avx2(auVar52,auVar21);
        auVar51 = vpaddd_avx2(auVar51,auVar52);
        auVar52 = vpmovsxwd_avx2(auVar19._16_16_);
        auVar21 = vpmovsxwd_avx2(auVar28._16_16_);
        auVar52 = vpaddd_avx2(auVar52,auVar21);
        auVar21 = vpmovzxwd_avx2(auVar18._16_16_);
        auVar33._4_4_ = iVar13;
        auVar33._0_4_ = iVar13;
        auVar33._8_4_ = iVar13;
        auVar33._12_4_ = iVar13;
        auVar33._16_4_ = iVar13;
        auVar33._20_4_ = iVar13;
        auVar33._24_4_ = iVar13;
        auVar33._28_4_ = iVar13;
        auVar23 = vpmullw_avx2(auVar21,auVar33);
        auVar21 = vpmovsxwd_avx2(auVar29._16_16_);
        auVar21 = vpaddd_avx2(auVar21,auVar23);
        auVar23 = vpmovsxwd_avx2(auVar30._16_16_);
        auVar25 = vpmovsxwd_avx2(auVar31._16_16_);
        auVar23 = vpaddd_avx2(auVar25,auVar23);
        auVar19._2_2_ = uVar5;
        auVar19._0_2_ = uVar5;
        auVar19._4_2_ = uVar5;
        auVar19._6_2_ = uVar5;
        auVar19._8_2_ = uVar5;
        auVar19._10_2_ = uVar5;
        auVar19._12_2_ = uVar5;
        auVar19._14_2_ = uVar5;
        auVar19._16_2_ = uVar5;
        auVar19._18_2_ = uVar5;
        auVar19._20_2_ = uVar5;
        auVar19._22_2_ = uVar5;
        auVar19._24_2_ = uVar5;
        auVar19._26_2_ = uVar5;
        auVar19._28_2_ = uVar5;
        auVar19._30_2_ = uVar5;
        auVar25 = vpmullw_avx2(auVar19,auVar55);
        auVar55._2_2_ = uVar6;
        auVar55._0_2_ = uVar6;
        auVar55._4_2_ = uVar6;
        auVar55._6_2_ = uVar6;
        auVar55._8_2_ = uVar6;
        auVar55._10_2_ = uVar6;
        auVar55._12_2_ = uVar6;
        auVar55._14_2_ = uVar6;
        auVar55._16_2_ = uVar6;
        auVar55._18_2_ = uVar6;
        auVar55._20_2_ = uVar6;
        auVar55._22_2_ = uVar6;
        auVar55._24_2_ = uVar6;
        auVar55._26_2_ = uVar6;
        auVar55._28_2_ = uVar6;
        auVar55._30_2_ = uVar6;
        auVar18 = vpmullw_avx2(auVar55,auVar54);
        auVar19 = vpmullw_avx2(auVar38,auVar20);
        auVar28 = vpmullw_avx2(auVar36,auVar22);
        auVar55 = vpaddd_avx2(auVar52,auVar23);
        auVar22 = vpand_avx2(auVar56,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])((long)src + 0x20) + lVar42));
        auVar24 = vpmullw_avx2(auVar34,auVar24);
        auVar52 = vpmovsxwd_avx2(auVar32._16_16_);
        auVar54 = vpmovsxwd_avx2(auVar27._16_16_);
        auVar52 = vpaddd_avx2(auVar54,auVar52);
        auVar54 = vpmovzxwd_avx2(auVar22._0_16_);
        auVar23 = vpmullw_avx2(auVar54,auVar33);
        auVar54 = vpmovsxwd_avx2(auVar16._16_16_);
        auVar54 = vpaddd_avx2(auVar21,auVar54);
        auVar55 = vpaddd_avx2(auVar55,auVar54);
        auVar54 = vpmovsxwd_avx2(auVar25._0_16_);
        auVar20 = vpmovsxwd_avx2(auVar18._0_16_);
        auVar54 = vpaddd_avx2(auVar54,auVar20);
        auVar20 = vpmovsxwd_avx2(auVar19._0_16_);
        auVar20 = vpaddd_avx2(auVar23,auVar20);
        auVar21 = vpmovsxwd_avx2(auVar28._0_16_);
        auVar23 = vpmovsxwd_avx2(auVar24._0_16_);
        auVar21 = vpaddd_avx2(auVar23,auVar21);
        auVar16._2_2_ = uVar10;
        auVar16._0_2_ = uVar10;
        auVar16._4_2_ = uVar10;
        auVar16._6_2_ = uVar10;
        auVar16._8_2_ = uVar10;
        auVar16._10_2_ = uVar10;
        auVar16._12_2_ = uVar10;
        auVar16._14_2_ = uVar10;
        auVar16._16_2_ = uVar10;
        auVar16._18_2_ = uVar10;
        auVar16._20_2_ = uVar10;
        auVar16._22_2_ = uVar10;
        auVar16._24_2_ = uVar10;
        auVar16._26_2_ = uVar10;
        auVar16._28_2_ = uVar10;
        auVar16._30_2_ = uVar10;
        auVar26 = vpmullw_avx2(auVar16,auVar26);
        auVar27._2_2_ = uVar11;
        auVar27._0_2_ = uVar11;
        auVar27._4_2_ = uVar11;
        auVar27._6_2_ = uVar11;
        auVar27._8_2_ = uVar11;
        auVar27._10_2_ = uVar11;
        auVar27._12_2_ = uVar11;
        auVar27._14_2_ = uVar11;
        auVar27._16_2_ = uVar11;
        auVar27._18_2_ = uVar11;
        auVar27._20_2_ = uVar11;
        auVar27._22_2_ = uVar11;
        auVar27._24_2_ = uVar11;
        auVar27._26_2_ = uVar11;
        auVar27._28_2_ = uVar11;
        auVar27._30_2_ = uVar11;
        auVar27 = vpmullw_avx2(auVar27,auVar15);
        auVar54 = vpaddd_avx2(auVar21,auVar54);
        auVar21 = vpmovsxwd_avx2(auVar26._0_16_);
        auVar23 = vpmovsxwd_avx2(auVar27._0_16_);
        auVar21 = vpaddd_avx2(auVar23,auVar21);
        auVar23._2_2_ = uVar12;
        auVar23._0_2_ = uVar12;
        auVar23._4_2_ = uVar12;
        auVar23._6_2_ = uVar12;
        auVar23._8_2_ = uVar12;
        auVar23._10_2_ = uVar12;
        auVar23._12_2_ = uVar12;
        auVar23._14_2_ = uVar12;
        auVar23._16_2_ = uVar12;
        auVar23._18_2_ = uVar12;
        auVar23._20_2_ = uVar12;
        auVar23._22_2_ = uVar12;
        auVar23._24_2_ = uVar12;
        auVar23._26_2_ = uVar12;
        auVar23._28_2_ = uVar12;
        auVar23._30_2_ = uVar12;
        auVar15 = vpmullw_avx2(auVar23,auVar17);
        auVar23 = vpmovsxwd_avx2(auVar15._0_16_);
        auVar20 = vpaddd_avx2(auVar20,auVar23);
        auVar54 = vpaddd_avx2(auVar54,auVar20);
        auVar20 = vpmovsxwd_avx2(auVar25._16_16_);
        auVar23 = vpmovsxwd_avx2(auVar18._16_16_);
        auVar20 = vpaddd_avx2(auVar20,auVar23);
        auVar22 = vpmovzxwd_avx2(auVar22._16_16_);
        auVar23 = vpmullw_avx2(auVar22,auVar33);
        auVar22 = vpmovsxwd_avx2(auVar19._16_16_);
        auVar22 = vpaddd_avx2(auVar22,auVar23);
        auVar23 = vpmovsxwd_avx2(auVar28._16_16_);
        auVar24 = vpmovsxwd_avx2(auVar24._16_16_);
        auVar23 = vpaddd_avx2(auVar24,auVar23);
        auVar20 = vpaddd_avx2(auVar20,auVar23);
        auVar23 = vpmovsxwd_avx2(auVar26._16_16_);
        auVar24 = vpmovsxwd_avx2(auVar27._16_16_);
        auVar23 = vpaddd_avx2(auVar24,auVar23);
        auVar24 = vpmovsxwd_avx2(auVar15._16_16_);
        auVar22 = vpaddd_avx2(auVar22,auVar24);
        auVar20 = vpaddd_avx2(auVar20,auVar22);
        auVar22._8_4_ = 0x20;
        auVar22._0_8_ = 0x2000000020;
        auVar22._12_4_ = 0x20;
        auVar22._16_4_ = 0x20;
        auVar22._20_4_ = 0x20;
        auVar22._24_4_ = 0x20;
        auVar22._28_4_ = 0x20;
        auVar14 = vpaddd_avx2(auVar22,auVar14);
        auVar51 = vpaddd_avx2(auVar14,auVar51);
        auVar52 = vpaddd_avx2(auVar22,auVar52);
        auVar55 = vpaddd_avx2(auVar55,auVar52);
        auVar52 = vpaddd_avx2(auVar21,auVar22);
        auVar52 = vpaddd_avx2(auVar54,auVar52);
        auVar54 = vpaddd_avx2(auVar23,auVar22);
        auVar54 = vpaddd_avx2(auVar20,auVar54);
        auVar51 = vpsrad_avx2(auVar51,6);
        auVar55 = vpsrad_avx2(auVar55,6);
        auVar51 = vpackssdw_avx2(auVar51,auVar55);
        auVar55 = vpsrad_avx2(auVar52,6);
        auVar52 = vpsrad_avx2(auVar54,6);
        auVar55 = vpackssdw_avx2(auVar55,auVar52);
        auVar51 = vpermq_avx2(auVar51,0xd8);
        auVar52._2_2_ = uVar50;
        auVar52._0_2_ = uVar50;
        auVar52._4_2_ = uVar50;
        auVar52._6_2_ = uVar50;
        auVar52._8_2_ = uVar50;
        auVar52._10_2_ = uVar50;
        auVar52._12_2_ = uVar50;
        auVar52._14_2_ = uVar50;
        auVar52._16_2_ = uVar50;
        auVar52._18_2_ = uVar50;
        auVar52._20_2_ = uVar50;
        auVar52._22_2_ = uVar50;
        auVar52._24_2_ = uVar50;
        auVar52._26_2_ = uVar50;
        auVar52._28_2_ = uVar50;
        auVar52._30_2_ = uVar50;
        auVar51 = vpminsw_avx2(auVar51,auVar52);
        auVar51 = vpmaxsw_avx2(auVar51,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar55 = vpermq_avx2(auVar55,0xd8);
        auVar54._8_2_ = 0xff00;
        auVar54._0_8_ = 0xff00ff00ff00ff00;
        auVar54._10_2_ = 0xff00;
        auVar54._12_2_ = 0xff00;
        auVar54._14_2_ = 0xff00;
        auVar54._16_2_ = 0xff00;
        auVar54._18_2_ = 0xff00;
        auVar54._20_2_ = 0xff00;
        auVar54._22_2_ = 0xff00;
        auVar54._24_2_ = 0xff00;
        auVar54._26_2_ = 0xff00;
        auVar54._28_2_ = 0xff00;
        auVar54._30_2_ = 0xff00;
        auVar55 = vpminsw_avx2(auVar55,auVar52);
        auVar51 = vpblendvb_avx2(auVar51,*(undefined1 (*) [32])(*(undefined1 (*) [32])dst + lVar42),
                                 auVar54);
        auVar55 = vpmaxsw_avx2(auVar55,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar55 = vpblendvb_avx2(auVar55,*(undefined1 (*) [32])
                                          (*(undefined1 (*) [32])((long)dst + 0x20) + lVar42),
                                 auVar54);
        *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + lVar42) = auVar51;
        *(undefined1 (*) [32])(*(undefined1 (*) [32])((long)dst + 0x20) + lVar42) = auVar55;
      }
    }
    dst = *(undefined1 (*) [32])dst + i_dst;
    src = (pel *)pauVar1;
  }
  return;
}

Assistant:

void uavs3d_alf_one_lcu_one_chroma_avx2(pel *dst, int i_dst, pel *src, int i_src, int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *imgPad1, *imgPad2, *imgPad3, *imgPad4, *imgPad5, *imgPad6;

    __m256i T00, T01, T10, T11, T20, T21, T30, T31, T40, T41, T50, T51, T60, T61, T70, T71, T80, T81;
    __m256i T8;
    __m256i T000, T001, T010, T011, T100, T101, T110, T111, T200, T201, T210, T211, T310, T311, T300, T301, T400, T401, T410, T411, T500, T501, T510, T511, T600, T601, T610, T611, T700, T701, T710, T711;
    __m256i E00, E01, E10, E11;
    __m256i C0, C1, C2, C3, C4, C5, C6, C7, C8;
    __m256i S0, S00, S01, S1, S10, S11, S2, S20, S21, S3, S30, S31, S4, S40, S41, S5, S50, S51, S6, S7, S60, S61, S70, S71, S80, S81, S82, S83, SS1, SS2, SS3, SS4;
    __m256i mAddOffset;
    __m256i mZero = _mm256_set1_epi16(0);
    __m256i mMax = _mm256_set1_epi16((short)((1 << sample_bit_depth) - 1));
    __m256i uv_mask = _mm256_set1_epi16(0xff);

    int i, j;
    int startPos = 0;
    int endPos = lcu_height;

    C0 = _mm256_set1_epi16(coef[0]);
    C1 = _mm256_set1_epi16(coef[2]);
    C2 = _mm256_set1_epi16(coef[4]);
    C3 = _mm256_set1_epi16(coef[6]);
    C4 = _mm256_set1_epi16(coef[8]);
    C5 = _mm256_set1_epi16(coef[10]);
    C6 = _mm256_set1_epi16(coef[12]);
    C7 = _mm256_set1_epi16(coef[14]);
    C8 = _mm256_set1_epi32(coef[16]);

    mAddOffset = _mm256_set1_epi32(32);

    for (i = startPos; i < endPos; i++) {
        imgPad1 = src + i_src;
        imgPad2 = src - i_src;
        imgPad3 = src + 2 * i_src;
        imgPad4 = src - 2 * i_src;
        imgPad5 = src + 3 * i_src;
        imgPad6 = src - 3 * i_src;
        if (i < 3) {
            if (i == 0) {
                imgPad4 = imgPad2 = src;
            }
            else if (i == 1) {
                imgPad4 = imgPad2;
            }
            imgPad6 = imgPad4;
        }
        else if (i > lcu_height - 4) {
            if (i == lcu_height - 1) {
                imgPad3 = imgPad1 = src;
            }
            else if (i == lcu_height - 2) {
                imgPad3 = imgPad1;
            }
            imgPad5 = imgPad3;
        }

        if (lcu_width <= 16) {
            T00 = _mm256_loadu_si256((__m256i*)&imgPad6[0]);
            T000 = _mm256_and_si256(T00, uv_mask);
            T00 = _mm256_loadu_si256((__m256i*)&imgPad5[0]);
            T010 = _mm256_and_si256(T00, uv_mask);
            E00 = _mm256_add_epi16(T000, T010);
            S00 = _mm256_mullo_epi16(C0, E00);//前16个像素所有C0*P0的结果

            T10 = _mm256_loadu_si256((__m256i*)&imgPad4[0]);
            T100 = _mm256_and_si256(T10, uv_mask);
            T11 = _mm256_loadu_si256((__m256i*)&imgPad3[0]);
            T110 = _mm256_and_si256(T11, uv_mask);
            E10 = _mm256_add_epi16(T100, T110);
            S10 = _mm256_mullo_epi16(C1, E10);//前16个像素所有C1*P1的结果


            T20 = _mm256_loadu_si256((__m256i*)&imgPad2[0 - 2]);
            T200 = _mm256_and_si256(T20, uv_mask);
            T30 = _mm256_loadu_si256((__m256i*)&imgPad2[0]);
            T300 = _mm256_and_si256(T30, uv_mask);
            T40 = _mm256_loadu_si256((__m256i*)&imgPad2[0 + 2]);
            T400 = _mm256_and_si256(T40, uv_mask);

            T41 = _mm256_loadu_si256((__m256i*)&imgPad1[0 - 2]);
            T410 = _mm256_and_si256(T41, uv_mask);
            T31 = _mm256_loadu_si256((__m256i*)&imgPad1[0]);
            T310 = _mm256_and_si256(T31, uv_mask);
            T21 = _mm256_loadu_si256((__m256i*)&imgPad1[0 + 2]);
            T210 = _mm256_and_si256(T21, uv_mask);

            T20 = _mm256_add_epi16(T200, T210);
            T30 = _mm256_add_epi16(T300, T310);
            T40 = _mm256_add_epi16(T400, T410);


            S20 = _mm256_mullo_epi16(T20, C2);
            S30 = _mm256_mullo_epi16(T30, C3);
            S40 = _mm256_mullo_epi16(T40, C4);

            T50 = _mm256_loadu_si256((__m256i*)&src[0 - 6]);
            T500 = _mm256_and_si256(T50, uv_mask);
            T60 = _mm256_loadu_si256((__m256i*)&src[0 - 4]);
            T600 = _mm256_and_si256(T60, uv_mask);
            T70 = _mm256_loadu_si256((__m256i*)&src[0 - 2]);
            T700 = _mm256_and_si256(T70, uv_mask);
            T8 = _mm256_loadu_si256((__m256i*)&src[0]);
            T80 = _mm256_and_si256(T8, uv_mask);
            T71 = _mm256_loadu_si256((__m256i*)&src[0 + 2]);
            T710 = _mm256_and_si256(T71, uv_mask);
            T61 = _mm256_loadu_si256((__m256i*)&src[0 + 4]);
            T610 = _mm256_and_si256(T61, uv_mask);
            T51 = _mm256_loadu_si256((__m256i*)&src[0 + 6]);
            T510 = _mm256_and_si256(T51, uv_mask);

            T50 = _mm256_add_epi16(T500, T510);
            T60 = _mm256_add_epi16(T600, T610);
            T70 = _mm256_add_epi16(T700, T710);

            S50 = _mm256_mullo_epi16(T50, C5);
            S60 = _mm256_mullo_epi16(T60, C6);
            S70 = _mm256_mullo_epi16(T70, C7);

            S80 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(T80));
            S81 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(T80, 1));
            S80 = _mm256_mullo_epi16(S80, C8);
            S81 = _mm256_mullo_epi16(S81, C8);

            S0 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S00));
            S1 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S10));
            S2 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S20));
            S3 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S30));
            S4 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S40));
            S5 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S50));
            S6 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S60));
            S7 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S70));
            S0 = _mm256_add_epi32(S0, S1);
            S2 = _mm256_add_epi32(S2, S3);
            S4 = _mm256_add_epi32(S4, S5);
            S6 = _mm256_add_epi32(S6, S7);
            S0 = _mm256_add_epi32(S0, S2);
            S4 = _mm256_add_epi32(S4, S6);
            SS1 = _mm256_add_epi32(S0, S4);
            SS1 = _mm256_add_epi32(SS1, S80);    //0-7

            S0 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S00, 1));
            S1 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S10, 1));
            S2 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S20, 1));
            S3 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S30, 1));
            S4 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S40, 1));
            S5 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S50, 1));
            S6 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S60, 1));
            S7 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S70, 1));
            //S8 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S80, 1));
            S0 = _mm256_add_epi32(S0, S1);
            S2 = _mm256_add_epi32(S2, S3);
            S4 = _mm256_add_epi32(S4, S5);
            S6 = _mm256_add_epi32(S6, S7);
            S0 = _mm256_add_epi32(S0, S2);
            S4 = _mm256_add_epi32(S4, S6);
            SS2 = _mm256_add_epi32(S0, S4);
            SS2 = _mm256_add_epi32(SS2, S81);    //8-15

            SS1 = _mm256_add_epi32(SS1, mAddOffset);
            SS2 = _mm256_add_epi32(SS2, mAddOffset);

            SS1 = _mm256_srai_epi32(SS1, 6);
            SS2 = _mm256_srai_epi32(SS2, 6);

            SS1 = _mm256_packs_epi32(SS1, SS2);
            SS1 = _mm256_permute4x64_epi64(SS1, 0xd8);

            T00 = _mm256_loadu_si256((__m256i*)&dst[0]);

            SS1 = _mm256_min_epi16(SS1, mMax);
            SS1 = _mm256_max_epi16(SS1, mZero);

            T00 = _mm256_blendv_epi8(T00, SS1, uv_mask);
            _mm256_storeu_si256((__m256i*)(dst), T00);
        }
        else {
            for (j = 0; j < lcu_width << 1; j += 64) {
                T00 = _mm256_loadu_si256((__m256i*)&imgPad6[j]);
                T01 = _mm256_loadu_si256((__m256i*)&imgPad6[j + 32]);
                T000 = _mm256_and_si256(T00, uv_mask);
                T001 = _mm256_and_si256(T01, uv_mask);
                T00 = _mm256_loadu_si256((__m256i*)&imgPad5[j]);
                T01 = _mm256_loadu_si256((__m256i*)&imgPad5[j + 32]);
                T010 = _mm256_and_si256(T00, uv_mask);
                T011 = _mm256_and_si256(T01, uv_mask);
                E00 = _mm256_add_epi16(T000, T010);
                E01 = _mm256_add_epi16(T001, T011);
                S00 = _mm256_mullo_epi16(C0, E00);//前16个像素所有C0*P0的结果
                S01 = _mm256_mullo_epi16(C0, E01);//后16个像素所有C0*P0的结果

                T10 = _mm256_loadu_si256((__m256i*)&imgPad4[j]);
                T11 = _mm256_loadu_si256((__m256i*)&imgPad4[j + 32]);
                T100 = _mm256_and_si256(T10, uv_mask);
                T101 = _mm256_and_si256(T11, uv_mask);
                T11 = _mm256_loadu_si256((__m256i*)&imgPad3[j]);
                T00 = _mm256_loadu_si256((__m256i*)&imgPad3[j + 32]);
                T110 = _mm256_and_si256(T11, uv_mask);
                T111 = _mm256_and_si256(T00, uv_mask);
                E10 = _mm256_add_epi16(T100, T110);
                E11 = _mm256_add_epi16(T101, T111);
                S10 = _mm256_mullo_epi16(C1, E10);//前16个像素所有C1*P1的结果
                S11 = _mm256_mullo_epi16(C1, E11);//后16个像素所有C1*P1的结果


                T20 = _mm256_loadu_si256((__m256i*)&imgPad2[j - 2]);
                T30 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 30]);
                T200 = _mm256_and_si256(T20, uv_mask);
                T201 = _mm256_and_si256(T30, uv_mask);
                T30 = _mm256_loadu_si256((__m256i*)&imgPad2[j]);
                T40 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 32]);
                T300 = _mm256_and_si256(T30, uv_mask);
                T301 = _mm256_and_si256(T40, uv_mask);
                T40 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 2]);
                T41 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 34]);
                T400 = _mm256_and_si256(T40, uv_mask);
                T401 = _mm256_and_si256(T41, uv_mask);

                T41 = _mm256_loadu_si256((__m256i*)&imgPad1[j - 2]);
                T40 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 30]);
                T410 = _mm256_and_si256(T41, uv_mask);
                T411 = _mm256_and_si256(T40, uv_mask);
                T31 = _mm256_loadu_si256((__m256i*)&imgPad1[j]);
                T00 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 32]);
                T310 = _mm256_and_si256(T31, uv_mask);
                T311 = _mm256_and_si256(T00, uv_mask);
                T21 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 2]);
                T01 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 34]);
                T210 = _mm256_and_si256(T21, uv_mask);
                T211 = _mm256_and_si256(T01, uv_mask);

                T20 = _mm256_add_epi16(T200, T210); // 前16个数
                T21 = _mm256_add_epi16(T201, T211); //后16个数
                T30 = _mm256_add_epi16(T300, T310);
                T31 = _mm256_add_epi16(T301, T311);
                T40 = _mm256_add_epi16(T400, T410);
                T41 = _mm256_add_epi16(T401, T411);


                S20 = _mm256_mullo_epi16(T20, C2);
                S21 = _mm256_mullo_epi16(T21, C2);
                S30 = _mm256_mullo_epi16(T30, C3);
                S31 = _mm256_mullo_epi16(T31, C3);
                S40 = _mm256_mullo_epi16(T40, C4);
                S41 = _mm256_mullo_epi16(T41, C4);

                T50 = _mm256_loadu_si256((__m256i*)&src[j - 6]);
                T00 = _mm256_loadu_si256((__m256i*)&src[j + 26]);
                T500 = _mm256_and_si256(T50, uv_mask);
                T501 = _mm256_and_si256(T00, uv_mask);
                T60 = _mm256_loadu_si256((__m256i*)&src[j - 4]);
                T20 = _mm256_loadu_si256((__m256i*)&src[j + 28]);
                T600 = _mm256_and_si256(T60, uv_mask);
                T601 = _mm256_and_si256(T20, uv_mask);
                T70 = _mm256_loadu_si256((__m256i*)&src[j - 2]);
                T30 = _mm256_loadu_si256((__m256i*)&src[j + 30]);
                T700 = _mm256_and_si256(T70, uv_mask);
                T701 = _mm256_and_si256(T30, uv_mask);
                T8 = _mm256_loadu_si256((__m256i*)&src[j]);
                T01 = _mm256_loadu_si256((__m256i*)&src[j + 32]);
                T80 = _mm256_and_si256(T8, uv_mask);
                T81 = _mm256_and_si256(T01, uv_mask);
                T71 = _mm256_loadu_si256((__m256i*)&src[j + 2]);
                T11 = _mm256_loadu_si256((__m256i*)&src[j + 34]);
                T710 = _mm256_and_si256(T71, uv_mask);
                T711 = _mm256_and_si256(T11, uv_mask);
                T61 = _mm256_loadu_si256((__m256i*)&src[j + 4]);
                T21 = _mm256_loadu_si256((__m256i*)&src[j + 36]);
                T610 = _mm256_and_si256(T61, uv_mask);
                T611 = _mm256_and_si256(T21, uv_mask);
                T51 = _mm256_loadu_si256((__m256i*)&src[j + 6]);
                T31 = _mm256_loadu_si256((__m256i*)&src[j + 38]);
                T510 = _mm256_and_si256(T51, uv_mask);
                T511 = _mm256_and_si256(T31, uv_mask);

                T50 = _mm256_add_epi16(T500, T510);
                T51 = _mm256_add_epi16(T501, T511);
                T60 = _mm256_add_epi16(T600, T610);
                T61 = _mm256_add_epi16(T601, T611);
                T70 = _mm256_add_epi16(T700, T710);
                T71 = _mm256_add_epi16(T701, T711);

                S50 = _mm256_mullo_epi16(T50, C5);
                S51 = _mm256_mullo_epi16(T51, C5);
                S60 = _mm256_mullo_epi16(T60, C6);
                S61 = _mm256_mullo_epi16(T61, C6);
                S70 = _mm256_mullo_epi16(T70, C7);
                S71 = _mm256_mullo_epi16(T71, C7);

                S80 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(T80));
                S81 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(T80, 1));
                S82 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(T81));
                S83 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(T81, 1));
                S80 = _mm256_mullo_epi16(S80, C8);
                S81 = _mm256_mullo_epi16(S81, C8);
                S82 = _mm256_mullo_epi16(S82, C8);
                S83 = _mm256_mullo_epi16(S83, C8);

                S0 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S00));
                S1 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S10));
                S2 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S20));
                S3 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S30));
                S4 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S40));
                S5 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S50));
                S6 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S60));
                S7 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S70));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS1 = _mm256_add_epi32(S0, S4);
                SS1 = _mm256_add_epi32(SS1, S80);    //0-7

                S0 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S00, 1));
                S1 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S10, 1));
                S2 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S20, 1));
                S3 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S30, 1));
                S4 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S40, 1));
                S5 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S50, 1));
                S6 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S60, 1));
                S7 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S70, 1));
                //S8 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S80, 1));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS2 = _mm256_add_epi32(S0, S4);
                SS2 = _mm256_add_epi32(SS2, S81);    //8-15

                S0 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S01));
                S1 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S11));
                S2 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S21));
                S3 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S31));
                S4 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S41));
                S5 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S51));
                S6 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S61));
                S7 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S71));
                //S8 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S81));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS3 = _mm256_add_epi32(S0, S4);
                SS3 = _mm256_add_epi32(SS3, S82);    //16-23

                S0 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S01, 1));
                S1 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S11, 1));
                S2 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S21, 1));
                S3 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S31, 1));
                S4 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S41, 1));
                S5 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S51, 1));
                S6 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S61, 1));
                S7 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S71, 1));
                //S8 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S81, 1));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS4 = _mm256_add_epi32(S0, S4);
                SS4 = _mm256_add_epi32(SS4, S83);    //24-31

                SS1 = _mm256_add_epi32(SS1, mAddOffset);
                SS2 = _mm256_add_epi32(SS2, mAddOffset);
                SS3 = _mm256_add_epi32(SS3, mAddOffset);
                SS4 = _mm256_add_epi32(SS4, mAddOffset);

                SS1 = _mm256_srai_epi32(SS1, 6);
                SS2 = _mm256_srai_epi32(SS2, 6);
                SS3 = _mm256_srai_epi32(SS3, 6);
                SS4 = _mm256_srai_epi32(SS4, 6);

                SS1 = _mm256_packs_epi32(SS1, SS2);
                SS3 = _mm256_packs_epi32(SS3, SS4);
                SS1 = _mm256_permute4x64_epi64(SS1, 0xd8);
                SS3 = _mm256_permute4x64_epi64(SS3, 0xd8);

                T00 = _mm256_loadu_si256((__m256i*)&dst[j]);
                T01 = _mm256_loadu_si256((__m256i*)&dst[j + 32]);

                SS1 = _mm256_min_epi16(SS1, mMax);
                SS1 = _mm256_max_epi16(SS1, mZero);
                SS3 = _mm256_min_epi16(SS3, mMax);
                SS3 = _mm256_max_epi16(SS3, mZero);

                T00 = _mm256_blendv_epi8(T00, SS1, uv_mask);
                T01 = _mm256_blendv_epi8(T01, SS3, uv_mask);
                _mm256_storeu_si256((__m256i*)(dst + j), T00);
                _mm256_storeu_si256((__m256i*)(dst + j + 32), T01);
            }
        }
        src += i_src;
        dst += i_dst;
    }
}